

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

int __thiscall ON_PolyCurve::CloseGaps(ON_PolyCurve *this)

{
  int iVar1;
  bool bVar2;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar3;
  uint gap_index;
  uint segment_index;
  uint uVar4;
  
  iVar3 = 0;
  uVar4 = 0;
  do {
    iVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    segment_index = uVar4;
    do {
      gap_index = segment_index + 1;
      if (iVar1 <= (int)gap_index) {
        gap_index = 0;
        break;
      }
      bVar2 = HasGapAt(this,segment_index);
      in_EDX = extraout_EDX;
      segment_index = gap_index;
    } while (!bVar2);
    if ((gap_index <= uVar4) ||
       ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)gap_index)) {
      return iVar3;
    }
    bVar2 = CloseGap(this,gap_index,in_EDX);
    iVar3 = iVar3 + (uint)bVar2;
    in_EDX = extraout_EDX_00;
    uVar4 = gap_index;
  } while( true );
}

Assistant:

int ON_PolyCurve::CloseGaps()
{
  int rc = 0;
  int segment_index0 = 0;
  int gap_index = 0;
  
  for(;;)
  {
    gap_index = FindNextGap(segment_index0);
    if ( gap_index <= segment_index0 || gap_index >= m_segment.Count() )
      break;
    if ( CloseGap(gap_index,0) )
      rc++;
    segment_index0 = gap_index;
  }

  return rc;
}